

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void ImGui::ShowDemoWindow(bool *p_open)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ImU32 IVar6;
  uint uVar7;
  ImGuiMouseCursor IVar8;
  ImGuiContext *pIVar9;
  MyDocument *pMVar10;
  undefined7 extraout_var;
  MyDocument **ppMVar11;
  char *pcVar12;
  char *pcVar13;
  ImGuiIO *pIVar14;
  ImDrawList *pIVar15;
  ImVec2 *pIVar16;
  unsigned_short *puVar17;
  int doc_n;
  int iVar18;
  bool *pbVar19;
  void *ptr_id;
  int doc_n_3;
  int i;
  undefined4 uVar20;
  ulong unaff_RBP;
  void *ptr_id_00;
  int open_count;
  int iVar21;
  int n_5;
  ulong uVar22;
  undefined8 *puVar23;
  int i_5;
  long lVar24;
  int i_3;
  undefined **ppuVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  double dVar29;
  ImVec2 IVar30;
  ImVec2 IVar31;
  undefined8 extraout_XMM0_Qb;
  float fVar32;
  ImVec2 canvas_size;
  float local_118;
  float fStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  float local_108;
  float fStack_104;
  ImVec2 local_f0;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  MyDocument *doc;
  char *pcStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  bool *local_58;
  ImVec2 local_50;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ImVec2 local_38;
  
  pIVar9 = GetCurrentContext();
  if (pIVar9 == (ImGuiContext *)0x0) {
    __assert_fail("ImGui::GetCurrentContext() != __null && \"Missing dear imgui context. Refer to examples app!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_demo.cpp"
                  ,0xc5,"void ImGui::ShowDemoWindow(bool *)");
  }
  if (ShowDemoWindow::show_app_documents == true) {
    if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
       (iVar18 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar18 != 0)) {
      ExampleAppDocuments::ExampleAppDocuments
                ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
      __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
    }
    bVar2 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
    if (bVar2) {
      bVar2 = BeginMenuBar();
      if (bVar2) {
        bVar2 = BeginMenu("File",true);
        if (bVar2) {
          iVar21 = 0;
          for (iVar18 = 0; iVar18 < ShowExampleAppDocuments(bool*)::app; iVar18 = iVar18 + 1) {
            pMVar10 = ImVector<MyDocument>::operator[]
                                ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar18
                                );
            iVar21 = iVar21 + (uint)pMVar10->Open;
          }
          bVar2 = BeginMenu("Open",iVar21 < ShowExampleAppDocuments(bool*)::app);
          if (bVar2) {
            for (iVar18 = 0; iVar18 < ShowExampleAppDocuments(bool*)::app; iVar18 = iVar18 + 1) {
              pMVar10 = ImVector<MyDocument>::operator[]
                                  ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,
                                   iVar18);
              if ((pMVar10->Open == false) &&
                 (bVar2 = MenuItem(pMVar10->Name,(char *)0x0,false,true), bVar2)) {
                pMVar10->Open = true;
              }
            }
            EndMenu();
          }
          iVar18 = 0;
          bVar2 = MenuItem("Close All Documents",(char *)0x0,false,iVar21 != 0);
          if (bVar2) {
            for (; iVar18 < ShowExampleAppDocuments(bool*)::app; iVar18 = iVar18 + 1) {
              pMVar10 = ImVector<MyDocument>::operator[]
                                  ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,
                                   iVar18);
              pMVar10->WantClose = true;
            }
          }
          MenuItem("Exit","Alt+F4",false,true);
          EndMenu();
        }
        EndMenuBar();
      }
      unaff_RBP = 0;
      while (iVar18 = (int)unaff_RBP, iVar18 < ShowExampleAppDocuments(bool*)::app) {
        pMVar10 = ImVector<MyDocument>::operator[]
                            ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar18);
        if (iVar18 != 0) {
          SameLine(0.0,-1.0);
        }
        PushID(pMVar10);
        bVar2 = Checkbox(pMVar10->Name,&pMVar10->Open);
        if ((bVar2) && (pMVar10->Open == false)) {
          pMVar10->Open = false;
          pMVar10->Dirty = false;
        }
        PopID();
        unaff_RBP = (ulong)(iVar18 + 1);
      }
      Separator();
      bVar2 = BeginTabBar("##tabs",0x41);
      if (bVar2) {
        for (iVar18 = 0; iVar18 < ShowExampleAppDocuments(bool*)::app; iVar18 = iVar18 + 1) {
          pMVar10 = ImVector<MyDocument>::operator[]
                              ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar18);
          bVar2 = pMVar10->Open;
          if ((bVar2 == false) && (pMVar10->OpenPrev == true)) {
            SetTabItemClosed(pMVar10->Name);
            bVar2 = pMVar10->Open;
          }
          pMVar10->OpenPrev = bVar2;
        }
        for (iVar18 = 0; iVar18 < ShowExampleAppDocuments(bool*)::app; iVar18 = iVar18 + 1) {
          pMVar10 = ImVector<MyDocument>::operator[]
                              ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar18);
          if (pMVar10->Open == true) {
            bVar2 = BeginTabItem(pMVar10->Name,&pMVar10->Open,(uint)pMVar10->Dirty);
            unaff_RBP = CONCAT71(extraout_var,bVar2) & 0xffffffff;
            if ((pMVar10->Open == false) && (pMVar10->Dirty == true)) {
              pMVar10->Open = true;
              pMVar10->WantClose = true;
            }
            MyDocument::DisplayContextMenu(pMVar10);
            if ((char)unaff_RBP != '\0') {
              MyDocument::DisplayContents(pMVar10);
              EndTabItem();
            }
          }
        }
        EndTabBar();
      }
      if ((ShowExampleAppDocuments(bool*)::close_queue == '\0') &&
         (iVar18 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::close_queue), iVar18 != 0))
      {
        _close_queue = (undefined1  [16])0x0;
        __cxa_atexit(ImVector<MyDocument_*>::~ImVector,&ShowExampleAppDocuments(bool*)::close_queue,
                     &__dso_handle);
        __cxa_guard_release(&ShowExampleAppDocuments(bool*)::close_queue);
      }
      if (ShowExampleAppDocuments(bool*)::close_queue == 0) {
        for (iVar18 = 0; iVar18 < ShowExampleAppDocuments(bool*)::app; iVar18 = iVar18 + 1) {
          doc = ImVector<MyDocument>::operator[]
                          ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,iVar18);
          if (doc->WantClose == true) {
            doc->WantClose = false;
            ImVector<MyDocument_*>::push_back
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue,&doc);
          }
        }
        if (ShowExampleAppDocuments(bool*)::close_queue == 0) goto LAB_0011d8ab;
      }
      iVar21 = 0;
      unaff_RBP = 0;
      iVar18 = ShowExampleAppDocuments(bool*)::close_queue;
      while (i = (int)unaff_RBP, i < iVar18) {
        ppMVar11 = ImVector<MyDocument_*>::operator[]
                             ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue
                              ,i);
        iVar21 = iVar21 + (uint)(*ppMVar11)->Dirty;
        iVar18 = ShowExampleAppDocuments(bool*)::close_queue;
        unaff_RBP = (ulong)(i + 1);
      }
      if (iVar21 == 0) {
        unaff_RBP = 0;
        while (iVar21 = (int)unaff_RBP, iVar21 < iVar18) {
          ppMVar11 = ImVector<MyDocument_*>::operator[]
                               ((ImVector<MyDocument_*> *)
                                &ShowExampleAppDocuments(bool*)::close_queue,iVar21);
          pMVar10 = *ppMVar11;
          pMVar10->Open = false;
          pMVar10->Dirty = false;
          iVar18 = ShowExampleAppDocuments(bool*)::close_queue;
          unaff_RBP = (ulong)(iVar21 + 1);
        }
        ImVector<MyDocument_*>::clear
                  ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
      }
      else {
        bVar2 = IsPopupOpen("Save?");
        if (!bVar2) {
          OpenPopup("Save?");
        }
        bVar2 = BeginPopupModal("Save?",(bool *)0x0,0);
        if (bVar2) {
          Text("Save change to the following items?");
          SetNextItemWidth(-1.0);
          bVar2 = ListBoxHeader("##",iVar21,6);
          if (bVar2) {
            unaff_RBP = 0;
            while( true ) {
              iVar18 = (int)unaff_RBP;
              if (ShowExampleAppDocuments(bool*)::close_queue <= iVar18) break;
              ppMVar11 = ImVector<MyDocument_*>::operator[]
                                   ((ImVector<MyDocument_*> *)
                                    &ShowExampleAppDocuments(bool*)::close_queue,iVar18);
              if ((*ppMVar11)->Dirty == true) {
                ppMVar11 = ImVector<MyDocument_*>::operator[]
                                     ((ImVector<MyDocument_*> *)
                                      &ShowExampleAppDocuments(bool*)::close_queue,iVar18);
                Text("%s",(*ppMVar11)->Name);
              }
              unaff_RBP = (ulong)(iVar18 + 1);
            }
            ListBoxFooter();
          }
          doc = (MyDocument *)0x42a00000;
          bVar2 = Button("Yes",(ImVec2 *)&doc);
          if (bVar2) {
            unaff_RBP = 0;
            while( true ) {
              iVar18 = (int)unaff_RBP;
              if (ShowExampleAppDocuments(bool*)::close_queue <= iVar18) break;
              ppMVar11 = ImVector<MyDocument_*>::operator[]
                                   ((ImVector<MyDocument_*> *)
                                    &ShowExampleAppDocuments(bool*)::close_queue,iVar18);
              if ((*ppMVar11)->Dirty == true) {
                ppMVar11 = ImVector<MyDocument_*>::operator[]
                                     ((ImVector<MyDocument_*> *)
                                      &ShowExampleAppDocuments(bool*)::close_queue,iVar18);
                (*ppMVar11)->Dirty = false;
              }
              ppMVar11 = ImVector<MyDocument_*>::operator[]
                                   ((ImVector<MyDocument_*> *)
                                    &ShowExampleAppDocuments(bool*)::close_queue,iVar18);
              pMVar10 = *ppMVar11;
              pMVar10->Open = false;
              pMVar10->Dirty = false;
              unaff_RBP = (ulong)(iVar18 + 1);
            }
            ImVector<MyDocument_*>::clear
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
            CloseCurrentPopup();
          }
          SameLine(0.0,-1.0);
          doc = (MyDocument *)0x42a00000;
          bVar2 = Button("No",(ImVec2 *)&doc);
          if (bVar2) {
            unaff_RBP = 0;
            while( true ) {
              iVar18 = (int)unaff_RBP;
              if (ShowExampleAppDocuments(bool*)::close_queue <= iVar18) break;
              ppMVar11 = ImVector<MyDocument_*>::operator[]
                                   ((ImVector<MyDocument_*> *)
                                    &ShowExampleAppDocuments(bool*)::close_queue,iVar18);
              pMVar10 = *ppMVar11;
              pMVar10->Open = false;
              pMVar10->Dirty = false;
              unaff_RBP = (ulong)(iVar18 + 1);
            }
            ImVector<MyDocument_*>::clear
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
            CloseCurrentPopup();
          }
          SameLine(0.0,-1.0);
          doc = SUB168(ZEXT416(0x42a00000),0);
          bVar2 = Button("Cancel",(ImVec2 *)&doc);
          if (bVar2) {
            ImVector<MyDocument_*>::clear
                      ((ImVector<MyDocument_*> *)&ShowExampleAppDocuments(bool*)::close_queue);
            CloseCurrentPopup();
          }
          EndPopup();
        }
      }
    }
LAB_0011d8ab:
    End();
  }
  if ((ShowDemoWindow::show_app_main_menu_bar == true) && (bVar2 = BeginMainMenuBar(), bVar2)) {
    bVar2 = BeginMenu("File",true);
    if (bVar2) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar2 = BeginMenu("Edit",true);
    if (bVar2) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar18 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar18 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    local_58 = p_open;
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar18 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar18 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    doc = (MyDocument *)0x43c8000043fa0000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    bVar2 = SmallButton("[Debug] Add 5 entries");
    if (bVar2) {
      iVar18 = 5;
      while (bVar2 = iVar18 != 0, iVar18 = iVar18 + -1, bVar2) {
        uVar5 = GetFrameCount();
        unaff_RBP = (ulong)uVar5;
        GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",unaff_RBP);
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
      }
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_58;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    doc = (MyDocument *)0x43dc000043fa0000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar2 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar2) {
      bVar2 = BeginMenuBar();
      if (bVar2) {
        bVar2 = BeginMenu("File",true);
        if (bVar2) {
          bVar2 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar2) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      doc = SUB168(ZEXT416(0x43160000),0);
      BeginChild("left pane",(ImVec2 *)&doc,true,0);
      unaff_RBP = 0;
      while (iVar18 = (int)unaff_RBP, iVar18 != 100) {
        sprintf((char *)&doc,"MyObject %d",unaff_RBP);
        canvas_size.x = 0.0;
        canvas_size.y = 0.0;
        bVar2 = Selectable((char *)&doc,iVar18 == ShowExampleAppLayout(bool*)::selected,0,
                           &canvas_size);
        if (bVar2) {
          ShowExampleAppLayout(bool*)::selected = iVar18;
        }
        unaff_RBP = (ulong)(iVar18 + 1);
      }
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar26 = GetFrameHeightWithSpacing();
      doc = (MyDocument *)((ulong)((uint)fVar26 ^ (uint)DAT_0017d110) << 0x20);
      BeginChild("item view",(ImVec2 *)&doc,false,0);
      Text("MyObject: %d");
      Separator();
      bVar2 = BeginTabBar("##Tabs",0);
      if (bVar2) {
        bVar2 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar2) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar2 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar2) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      doc = (MyDocument *)0x0;
      Button("Revert",(ImVec2 *)&doc);
      SameLine(0.0,-1.0);
      doc = (MyDocument *)0x0;
      Button("Save",(ImVec2 *)&doc);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    doc = (MyDocument *)0x43e1000043d70000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    iVar18 = 0;
    bVar2 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar2) {
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      doc = (MyDocument *)0x4000000040000000;
      PushStyleVar(10,(ImVec2 *)&doc);
      Columns(2,(char *)0x0,true);
      Separator();
      for (; iVar18 != 3; iVar18 = iVar18 + 1) {
        anon_func::funcs::ShowDummyObject("Object",iVar18);
      }
      Columns(1,(char *)0x0,true);
      Separator();
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    doc = (MyDocument *)0x4416000044020000;
    SetNextWindowSize((ImVec2 *)&doc,4);
    bVar2 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar2) {
      if ((ShowExampleAppLongText(bool*)::log == '\0') &&
         (iVar18 = __cxa_guard_acquire(&ShowExampleAppLongText(bool*)::log), iVar18 != 0)) {
        _log = (undefined1  [16])0x0;
        __cxa_atexit(ImGuiTextBuffer::~ImGuiTextBuffer,&ShowExampleAppLongText(bool*)::log,
                     &__dso_handle);
        __cxa_guard_release(&ShowExampleAppLongText(bool*)::log);
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar22 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar22 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar22)
      ;
      doc = (MyDocument *)0x0;
      bVar2 = Button("Clear",(ImVec2 *)&doc);
      if (bVar2) {
        ImVector<char>::clear((ImVector<char> *)&ShowExampleAppLongText(bool*)::log);
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      doc = (MyDocument *)0x0;
      bVar2 = Button("Add 1000 lines",(ImVec2 *)&doc);
      if (bVar2) {
        unaff_RBP = 0;
        while (iVar18 = (int)unaff_RBP, iVar18 != 1000) {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar18));
          unaff_RBP = (ulong)(iVar18 + 1);
        }
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      doc = (MyDocument *)0x0;
      BeginChild("Log",(ImVec2 *)&doc,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        doc = (MyDocument *)0x0;
        PushStyleVar(0xd,(ImVec2 *)&doc);
        for (unaff_RBP = 0; (int)unaff_RBP < (int)ShowExampleAppLongText(bool*)::lines;
            unaff_RBP = (ulong)((int)unaff_RBP + 1)) {
          Text("%i The quick brown fox jumps over the lazy dog",unaff_RBP);
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        doc = (MyDocument *)0x0;
        PushStyleVar(0xd,(ImVec2 *)&doc);
        ImGuiListClipper::Begin((ImGuiListClipper *)&doc,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar2 = ImGuiListClipper::Step((ImGuiListClipper *)&doc), bVar2) {
          uVar5 = (uint)local_c8;
          while( true ) {
            unaff_RBP = (ulong)uVar5;
            if (local_c8._4_4_ <= (int)uVar5) break;
            Text("%i The quick brown fox jumps over the lazy dog",unaff_RBP);
            uVar5 = uVar5 + 1;
          }
        }
        PopStyleVar(1);
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)&doc);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        pcVar12 = ImGuiTextBuffer::begin((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log);
        pcVar13 = ImGuiTextBuffer::end((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log);
        TextUnformatted(pcVar12,pcVar13);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar2 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar2) {
      Text(
          "Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
          );
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d");
      unaff_RBP = 0;
      for (iVar18 = 0; iVar18 < ShowExampleAppAutoResize(bool*)::lines; iVar18 = iVar18 + 1) {
        Text("%*sThis is line %d",unaff_RBP,"");
        unaff_RBP = (ulong)((int)unaff_RBP + 4);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      doc = (MyDocument *)0xbf800000;
      canvas_size.x = -1.0;
      canvas_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints((ImVec2 *)&doc,&canvas_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      doc = (MyDocument *)0xbf80000000000000;
      canvas_size.x = 3.4028235e+38;
      canvas_size.y = -1.0;
      SetNextWindowSizeConstraints((ImVec2 *)&doc,&canvas_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      doc = (MyDocument *)0x42c8000042c80000;
      canvas_size.x = 3.4028235e+38;
      canvas_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints((ImVec2 *)&doc,&canvas_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      doc = (MyDocument *)0xbf80000043c80000;
      canvas_size.x = 500.0;
      canvas_size.y = -1.0;
      SetNextWindowSizeConstraints((ImVec2 *)&doc,&canvas_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      doc = (MyDocument *)0x43c80000bf800000;
      canvas_size.x = -1.0;
      canvas_size.y = 500.0;
      SetNextWindowSizeConstraints((ImVec2 *)&doc,&canvas_size,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      doc = (MyDocument *)0x0;
      canvas_size.x = 3.4028235e+38;
      canvas_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                ((ImVec2 *)&doc,&canvas_size,
                 ShowExampleAppConstrainedResize::CustomConstraints::Square,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      doc = (MyDocument *)0x0;
      canvas_size.x = 3.4028235e+38;
      canvas_size.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                ((ImVec2 *)&doc,&canvas_size,
                 ShowExampleAppConstrainedResize::CustomConstraints::Step,(void *)0x64);
    }
    bVar2 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                  (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar2) {
      local_a8 = "Custom: Fixed Steps (100)";
      local_b8 = "Height 400-500";
      pcStack_b0 = "Custom: Always Square";
      local_c8 = "Width > 100, Height > 100";
      pcStack_c0 = "Width 400-500";
      doc = (MyDocument *)anon_var_dwarf_3105c;
      pcStack_d0 = "Resize horizontal only";
      canvas_size.x = 0.0;
      canvas_size.y = 0.0;
      bVar2 = Button("200x200",&canvas_size);
      if (bVar2) {
        canvas_size.x = 200.0;
        canvas_size.y = 200.0;
        SetWindowSize(&canvas_size,0);
      }
      SameLine(0.0,-1.0);
      canvas_size.x = 0.0;
      canvas_size.y = 0.0;
      bVar2 = Button("500x500",&canvas_size);
      if (bVar2) {
        canvas_size.x = 500.0;
        canvas_size.y = 500.0;
        SetWindowSize(&canvas_size,0);
      }
      SameLine(0.0,-1.0);
      canvas_size.x = 0.0;
      canvas_size.y = 0.0;
      bVar2 = Button("800x200",&canvas_size);
      if (bVar2) {
        canvas_size.x = 800.0;
        canvas_size.y = 200.0;
        SetWindowSize(&canvas_size,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)&doc,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d");
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      unaff_RBP = 0;
      for (iVar18 = 0; iVar18 < ShowExampleAppConstrainedResize(bool*)::display_lines;
          iVar18 = iVar18 + 1) {
        Text("%*sHello, sailor! Making this line long enough for the example.",unaff_RBP,"");
        unaff_RBP = (ulong)((int)unaff_RBP + 4);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar14 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner != 0xffffffff) {
      uVar22 = CONCAT44(-(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 2) == 0),
                        -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 1) == 0));
      doc = (MyDocument *)
            ((ulong)DAT_00181d10 & uVar22 |
            ~uVar22 & CONCAT44((pIVar14->DisplaySize).y + -10.0,(pIVar14->DisplaySize).x + -10.0));
      canvas_size = (ImVec2)(~uVar22 & DAT_0017d0c0);
      SetNextWindowPos((ImVec2 *)&doc,1,&canvas_size);
    }
    SetNextWindowBgAlpha(0.35);
    bVar2 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,
                  (uint)(ShowExampleAppSimpleOverlay(bool*)::corner != 0xffffffff) * 4 + 0xc116b);
    if (bVar2) {
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar2 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar2) {
        Text("Mouse Position: (%.1f,%.1f)",(double)(pIVar14->MousePos).x);
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar2 = BeginPopupContextWindow((char *)0x0,1,true);
      if (bVar2) {
        bVar2 = MenuItem("Custom",(char *)0x0,
                         ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        uVar5 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar2) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar2 = MenuItem("Top-left",(char *)0x0,!bVar2 && uVar5 == 0,true);
        uVar5 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar2) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar2 = MenuItem("Top-right",(char *)0x0,!bVar2 && uVar5 == 1,true);
        uVar5 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar2) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar2 = MenuItem("Bottom-left",(char *)0x0,!bVar2 && uVar5 == 2,true);
        uVar5 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar2) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar2 = MenuItem("Bottom-right",(char *)0x0,!bVar2 && uVar5 == 3,true);
        if (bVar2) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar2 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar2) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    doc = (MyDocument *)0x42c8000042c80000;
    canvas_size.x = 0.0;
    canvas_size.y = 0.0;
    SetNextWindowPos((ImVec2 *)&doc,4,&canvas_size);
    Begin("Same title as another window##1",(bool *)0x0,0);
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    doc = (MyDocument *)0x4348000042c80000;
    canvas_size.x = 0.0;
    canvas_size.y = 0.0;
    SetNextWindowPos((ImVec2 *)&doc,4,&canvas_size);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar29 = GetTime();
    unaff_RBP = (ulong)(uint)(int)"|/-\\"[(int)(dVar29 * 4.0) & 3];
    uVar5 = GetFrameCount();
    sprintf((char *)&doc,"Animated title %c %d###AnimatedTitle",unaff_RBP,(ulong)uVar5);
    canvas_size.x = 100.0;
    canvas_size.y = 300.0;
    local_f0.x = 0.0;
    local_f0.y = 0.0;
    SetNextWindowPos(&canvas_size,4,&local_f0);
    Begin((char *)&doc,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering != true) goto LAB_0011f626;
  bVar2 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
  if (bVar2) {
    pIVar15 = GetWindowDrawList();
    bVar2 = BeginTabBar("##TabBar",0);
    if (bVar2) {
      bVar2 = BeginTabItem("Primitives",(bool *)0x0,0);
      local_58 = p_open;
      if (bVar2) {
        if ((ShowExampleAppCustomRendering(bool*)::colf == '\0') &&
           (iVar18 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::colf), iVar18 != 0))
        {
          ShowExampleAppCustomRendering(bool*)::colf._0_8_ = 0x3f8000003f800000;
          ShowExampleAppCustomRendering(bool*)::colf._8_8_ = 0x3f8000003ecccccd;
          __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::colf);
        }
        DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,72.0,"%.0f",1.0);
        DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,"%.02f",
                  1.0);
        ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
        IVar30 = GetCursorScreenPos();
        doc = (MyDocument *)ShowExampleAppCustomRendering(bool*)::colf._0_8_;
        pcStack_d0 = (char *)ShowExampleAppCustomRendering(bool*)::colf._8_8_;
        IVar6 = ColorConvertFloat4ToU32((ImVec4 *)&doc);
        unaff_RBP = (ulong)IVar6;
        local_118 = IVar30.x;
        fStack_114 = IVar30.y;
        uStack_110 = (undefined4)extraout_XMM0_Qb;
        uStack_10c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
        local_48 = local_118 + 4.0;
        fStack_44 = fStack_114;
        uStack_40 = uStack_110;
        uStack_3c = uStack_10c;
        fVar26 = fStack_114 + 4.0;
        for (iVar18 = 0; iVar18 != 2; iVar18 = iVar18 + 1) {
          fVar28 = 1.0;
          if (iVar18 != 0) {
            fVar28 = ShowExampleAppCustomRendering(bool*)::thickness;
          }
          fVar27 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          doc = (MyDocument *)CONCAT44(fVar27 + fVar26,fVar27 + local_48);
          ImDrawList::AddCircle(pIVar15,(ImVec2 *)&doc,fVar27,IVar6,6,fVar28);
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48;
          _local_e8 = ZEXT416((uint)fVar32);
          fVar27 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          doc = (MyDocument *)CONCAT44(fVar27 + fVar26,fVar27 + fVar32);
          ImDrawList::AddCircle(pIVar15,(ImVec2 *)&doc,fVar27,IVar6,0x14,fVar28);
          fVar27 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_;
          _local_e8 = ZEXT416((uint)fVar27);
          doc = (MyDocument *)CONCAT44(fVar26,fVar27);
          canvas_size.x = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
          canvas_size.y = fVar26 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRect(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,0.0,0,fVar28);
          fVar27 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_;
          _local_e8 = ZEXT416((uint)fVar27);
          doc = (MyDocument *)CONCAT44(fVar26,fVar27);
          canvas_size.x = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
          canvas_size.y = fVar26 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRect(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,10.0,0xf,fVar28);
          fVar27 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_;
          _local_e8 = ZEXT416((uint)fVar27);
          doc = (MyDocument *)CONCAT44(fVar26,fVar27);
          canvas_size.x = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
          canvas_size.y = fVar26 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRect(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,10.0,9,fVar28);
          local_e8._0_4_ = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
          local_e8._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fVar26 + -0.5;
          fStack_e0 = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
          fStack_dc = ShowExampleAppCustomRendering(bool*)::sz + fStack_114 + 0.0;
          doc = (MyDocument *)
                CONCAT44(fVar26,ShowExampleAppCustomRendering(bool*)::sz * 0.5 +
                                (float)local_e8._0_4_);
          canvas_size.y = (float)local_e8._4_4_;
          canvas_size.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_e8._0_4_;
          local_f0.y = (float)local_e8._4_4_;
          local_f0.x = (float)local_e8._0_4_;
          ImDrawList::AddTriangle(pIVar15,(ImVec2 *)&doc,&canvas_size,&local_f0,IVar6,fVar28);
          canvas_size.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_;
          local_e8._0_4_ = canvas_size.x;
          doc = (MyDocument *)
                CONCAT44(fVar26,ShowExampleAppCustomRendering(bool*)::sz * 0.2 + canvas_size.x);
          canvas_size.y = fVar26 + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
          local_f0.y = canvas_size.y;
          local_f0.x = ShowExampleAppCustomRendering(bool*)::sz * 0.4 + canvas_size.x;
          ImDrawList::AddTriangle(pIVar15,(ImVec2 *)&doc,&canvas_size,&local_f0,IVar6,fVar28);
          fVar27 = ShowExampleAppCustomRendering(bool*)::sz * 0.4 + 10.0 + (float)local_e8._0_4_;
          _local_e8 = ZEXT416((uint)fVar27);
          doc = (MyDocument *)CONCAT44(fVar26,fVar27);
          canvas_size.y = fVar26;
          canvas_size.x = ShowExampleAppCustomRendering(bool*)::sz + fVar27;
          ImDrawList::AddLine(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,fVar28);
          local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_;
          fStack_e0 = (float)local_e8._4_4_ + 0.0;
          local_e8._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fVar26;
          fStack_dc = fStack_114 + 0.0;
          doc = (MyDocument *)CONCAT44(fVar26,local_e8._0_4_);
          canvas_size.y = ShowExampleAppCustomRendering(bool*)::sz + fVar26;
          canvas_size.x = (float)local_e8._0_4_;
          ImDrawList::AddLine(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,fVar28);
          local_e8._0_4_ = (float)local_e8._0_4_ + 10.0;
          doc = (MyDocument *)CONCAT44(fVar26,local_e8._0_4_);
          canvas_size.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_e8._0_4_;
          canvas_size.y = ShowExampleAppCustomRendering(bool*)::sz + fVar26;
          ImDrawList::AddLine(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,fVar28);
          fVar27 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_e8._0_4_;
          doc = (MyDocument *)CONCAT44(fVar26,fVar27);
          canvas_size.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + fVar26;
          canvas_size.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + fVar27;
          local_50.x = fVar27 + ShowExampleAppCustomRendering(bool*)::sz;
          local_50.y = fVar26 + ShowExampleAppCustomRendering(bool*)::sz;
          local_f0.x = local_50.x - ShowExampleAppCustomRendering(bool*)::sz * 1.3;
          local_f0.y = local_50.y - ShowExampleAppCustomRendering(bool*)::sz * 0.3;
          ImDrawList::AddBezierCurve
                    (pIVar15,(ImVec2 *)&doc,&canvas_size,&local_f0,&local_50,IVar6,fVar28,0);
          fVar26 = fVar26 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        }
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        doc = (MyDocument *)CONCAT44(fVar28 + fVar26,fVar28 + local_48);
        ImDrawList::AddCircleFilled(pIVar15,(ImVec2 *)&doc,fVar28,IVar6,6);
        local_48 = local_48 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        doc = (MyDocument *)CONCAT44(fVar28 + fVar26,fVar28 + local_48);
        ImDrawList::AddCircleFilled(pIVar15,(ImVec2 *)&doc,fVar28,IVar6,0x20);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48;
        doc = (MyDocument *)CONCAT44(fVar26,fVar28);
        canvas_size.x = fVar28 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_size.y = fVar26 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilled(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,0.0,0xf);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        doc = (MyDocument *)CONCAT44(fVar26,fVar28);
        canvas_size.x = fVar28 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_size.y = fVar26 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilled(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,10.0,0xf);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        doc = (MyDocument *)CONCAT44(fVar26,fVar28);
        canvas_size.x = fVar28 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_size.y = fVar26 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilled(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,10.0,9);
        fVar28 = fVar28 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        canvas_size.y = ShowExampleAppCustomRendering(bool*)::sz + fVar26 + -0.5;
        doc = (MyDocument *)CONCAT44(fVar26,ShowExampleAppCustomRendering(bool*)::sz * 0.5 + fVar28)
        ;
        canvas_size.x = ShowExampleAppCustomRendering(bool*)::sz + fVar28;
        local_f0.y = canvas_size.y;
        local_f0.x = fVar28;
        ImDrawList::AddTriangleFilled(pIVar15,(ImVec2 *)&doc,&canvas_size,&local_f0,IVar6);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        doc = (MyDocument *)CONCAT44(fVar26,ShowExampleAppCustomRendering(bool*)::sz * 0.2 + fVar28)
        ;
        canvas_size.y = fVar26 + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
        canvas_size.x = fVar28;
        local_f0.y = canvas_size.y;
        local_f0.x = ShowExampleAppCustomRendering(bool*)::sz * 0.4 + fVar28;
        ImDrawList::AddTriangleFilled(pIVar15,(ImVec2 *)&doc,&canvas_size,&local_f0,IVar6);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz * 0.4 + 10.0 + fVar28;
        doc = (MyDocument *)CONCAT44(fVar26,fVar28);
        canvas_size.x = fVar28 + ShowExampleAppCustomRendering(bool*)::sz;
        canvas_size.y = ShowExampleAppCustomRendering(bool*)::thickness + fVar26;
        ImDrawList::AddRectFilled(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,0.0,0xf);
        fVar28 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + fVar28;
        doc = (MyDocument *)CONCAT44(fVar26,fVar28);
        canvas_size.x = ShowExampleAppCustomRendering(bool*)::thickness + fVar28;
        canvas_size.y = ShowExampleAppCustomRendering(bool*)::sz + fVar26;
        ImDrawList::AddRectFilled(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,0.0,0xf);
        fVar28 = fVar28 + 20.0;
        doc = (MyDocument *)CONCAT44(fVar26,fVar28);
        canvas_size.x = fVar28 + 1.0;
        canvas_size.y = fVar26 + 1.0;
        ImDrawList::AddRectFilled(pIVar15,(ImVec2 *)&doc,&canvas_size,IVar6,0.0,0xf);
        doc = (MyDocument *)CONCAT44(fVar26,fVar28 + ShowExampleAppCustomRendering(bool*)::sz);
        canvas_size.x =
             fVar28 + ShowExampleAppCustomRendering(bool*)::sz +
             ShowExampleAppCustomRendering(bool*)::sz;
        canvas_size.y = fVar26 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilledMultiColor
                  (pIVar15,(ImVec2 *)&doc,&canvas_size,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00);
        doc = (MyDocument *)
              CONCAT44((ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0,
                       (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 9.8);
        Dummy((ImVec2 *)&doc);
        EndTabItem();
      }
      p_open = local_58;
      bVar2 = BeginTabItem("Canvas",(bool *)0x0,0);
      if (bVar2) {
        if ((ShowExampleAppCustomRendering(bool*)::points == '\0') &&
           (iVar18 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::points), iVar18 != 0
           )) {
          _points = (undefined1  [16])0x0;
          __cxa_atexit(ImVector<ImVec2>::~ImVector,&ShowExampleAppCustomRendering(bool*)::points,
                       &__dso_handle);
          __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::points);
        }
        doc = (MyDocument *)0x0;
        bVar2 = Button("Clear",(ImVec2 *)&doc);
        if (bVar2) {
          ImVector<ImVec2>::clear((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points)
          ;
        }
        if (1 < ShowExampleAppCustomRendering(bool*)::points) {
          SameLine(0.0,-1.0);
          doc = (MyDocument *)0x0;
          bVar2 = Button("Undo",(ImVec2 *)&doc);
          if (bVar2) {
            ImVector<ImVec2>::pop_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points);
            ImVector<ImVec2>::pop_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points);
          }
        }
        Text("Left-click and drag to add lines,\nRight-click to undo");
        IVar30 = GetCursorScreenPos();
        doc = (MyDocument *)IVar30;
        IVar31 = GetContentRegionAvail();
        fVar26 = IVar31.y;
        canvas_size = IVar31;
        if (IVar31.x < 50.0) {
          canvas_size.y = fVar26;
          canvas_size.x = 50.0;
          IVar31.x = 50.0;
          IVar31.y = 0.0;
        }
        if (fVar26 < 50.0) {
          canvas_size.y = 50.0;
          fVar26 = 50.0;
        }
        local_118 = IVar30.x;
        fStack_114 = IVar30.y;
        local_f0.x = local_118 + IVar31.x;
        local_f0.y = fStack_114 + fVar26;
        ImDrawList::AddRectFilledMultiColor
                  (pIVar15,(ImVec2 *)&doc,&local_f0,0xff323232,0xff3c3232,0xff463c3c,0xff3c3232);
        local_f0.x = SUB84(doc,0) + IVar31.x;
        local_f0.y = (float)((ulong)doc >> 0x20) + fVar26;
        ImDrawList::AddRect(pIVar15,(ImVec2 *)&doc,&local_f0,0xffffffff,0.0,0xf,1.0);
        InvisibleButton("canvas",&canvas_size);
        pIVar14 = GetIO();
        IVar30 = pIVar14->MousePos;
        fVar26 = doc._0_4_;
        pIVar14 = GetIO();
        local_108 = IVar30.x;
        local_f0.x = local_108 - fVar26;
        local_f0.y = (pIVar14->MousePos).y - doc._4_4_;
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_f0);
          bVar2 = IsMouseDown(0);
          uVar20 = (undefined4)CONCAT71((int7)(unaff_RBP >> 8),1);
          if (!bVar2) {
            ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
            goto LAB_0011f353;
          }
        }
        else {
LAB_0011f353:
          uVar20 = 0;
        }
        iVar18 = 0;
        bVar2 = IsItemHovered(0);
        if (bVar2) {
          if ((ShowExampleAppCustomRendering(bool*)::adding_line == '\0') &&
             (bVar2 = IsMouseClicked(0,false), bVar2)) {
            ImVector<ImVec2>::push_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_f0);
            ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
          }
          bVar2 = IsMouseClicked(1,false);
          if ((bVar2) && (ShowExampleAppCustomRendering(bool*)::points != 0)) {
            ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
            ImVector<ImVec2>::pop_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points);
            ImVector<ImVec2>::pop_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points);
            uVar20 = 0;
          }
        }
        local_e8._0_4_ = uVar20;
        IVar30.x = canvas_size.x + SUB84(doc,0);
        IVar30.y = canvas_size.y + (float)((ulong)doc >> 0x20);
        ImDrawList::PushClipRect(pIVar15,(ImVec2)doc,IVar30,true);
        for (; iVar18 < ShowExampleAppCustomRendering(bool*)::points + -1; iVar18 = iVar18 + 2) {
          fVar28 = doc._0_4_;
          pIVar16 = ImVector<ImVec2>::operator[]
                              ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                               iVar18);
          fVar27 = doc._4_4_;
          fVar26 = pIVar16->x;
          pIVar16 = ImVector<ImVec2>::operator[]
                              ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                               iVar18);
          local_50.x = fVar26 + fVar28;
          local_50.y = pIVar16->y + fVar27;
          fVar28 = doc._0_4_;
          pIVar16 = ImVector<ImVec2>::operator[]
                              ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                               iVar18 + 1);
          fVar27 = doc._4_4_;
          fVar26 = pIVar16->x;
          pIVar16 = ImVector<ImVec2>::operator[]
                              ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,
                               iVar18 + 1);
          local_38.x = fVar26 + fVar28;
          local_38.y = pIVar16->y + fVar27;
          ImDrawList::AddLine(pIVar15,&local_50,&local_38,0xff00ffff,2.0);
        }
        ImDrawList::PopClipRect(pIVar15);
        if (local_e8[0] != '\0') {
          ImVector<ImVec2>::pop_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points);
        }
        EndTabItem();
        p_open = local_58;
      }
      bVar2 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
      if (bVar2) {
        Checkbox("Draw in Background draw list",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg);
        SameLine(0.0,-1.0);
        HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
        Checkbox("Draw in Foreground draw list",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg);
        SameLine(0.0,-1.0);
        HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
        IVar30 = GetWindowPos();
        IVar31 = GetWindowSize();
        local_108 = IVar30.x;
        fStack_104 = IVar30.y;
        doc = (MyDocument *)CONCAT44(IVar31.y * 0.5 + fStack_104,IVar31.x * 0.5 + local_108);
        if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
          pIVar15 = GetBackgroundDrawList();
          ImDrawList::AddCircle(pIVar15,(ImVec2 *)&doc,IVar31.x * 0.6,0xc80000ff,0x30,14.0);
        }
        if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
          pIVar15 = GetForegroundDrawList();
          ImDrawList::AddCircle(pIVar15,(ImVec2 *)&doc,IVar31.y * 0.6,0xc800ff00,0x30,10.0);
        }
        EndTabItem();
      }
      EndTabBar();
    }
  }
  End();
LAB_0011f626:
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  uVar5 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar5 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar7 = uVar5 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar7 = uVar5;
  }
  uVar5 = uVar7 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar5 = uVar7;
  }
  uVar7 = uVar5 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar7 = uVar5;
  }
  uVar5 = uVar7 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar5 = uVar7;
  }
  uVar7 = uVar5 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar7 = uVar5;
  }
  uVar5 = uVar7 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar5 = uVar7;
  }
  uVar7 = uVar5 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar7 = uVar5;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (bool *)0x0;
  }
  doc = (MyDocument *)0x41a0000044228000;
  canvas_size.x = 0.0;
  canvas_size.y = 0.0;
  SetNextWindowPos((ImVec2 *)&doc,4,&canvas_size);
  doc = (MyDocument *)0x442a000044098000;
  SetNextWindowSize((ImVec2 *)&doc,4);
  bVar2 = Begin("Dear ImGui Demo",p_open,uVar7);
  if (bVar2) {
    fVar26 = GetFontSize();
    PushItemWidth(fVar26 * -12.0);
    bVar2 = BeginMenuBar();
    if (bVar2) {
      bVar2 = BeginMenu("Menu",true);
      if (bVar2) {
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar2 = BeginMenu("Examples",true);
      if (bVar2) {
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar2 = BeginMenu("Tools",true);
      if (bVar2) {
        MenuItem("Metrics",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    bVar2 = CollapsingHeader("Help",0);
    if (bVar2) {
      Text("PROGRAMMER GUIDE:");
      BulletText("Please see the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("Please see the comments in imgui.cpp.");
      BulletText("Please see the examples/ application.");
      BulletText("Enable \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Enable \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    bVar2 = CollapsingHeader("Configuration",0);
    if (bVar2) {
      pIVar14 = GetIO();
      bVar2 = TreeNode("Configuration##2");
      if (bVar2) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",(uint *)pIVar14,1);
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",(uint *)pIVar14,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Required back-end to feed in gamepad inputs in io.NavInputs[] and set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",(uint *)pIVar14,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",(uint *)pIVar14,0x10);
        if ((pIVar14->ConfigFlags & 0x10) != 0) {
          dVar29 = GetTime();
          fVar26 = fmodf((float)dVar29,0.4);
          if (fVar26 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          iVar18 = GetKeyIndex(0xc);
          bVar2 = IsKeyPressed(iVar18,true);
          if (bVar2) {
            *(byte *)&pIVar14->ConfigFlags = (byte)pIVar14->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",(uint *)pIVar14,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct back-end to not alter mouse cursor shape and visibility.");
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar14->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Set to false to disable blinking cursor, for users who consider it distracting")
        ;
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar14->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar14->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar14->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor for you. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        TreePop();
        Separator();
      }
      bVar2 = TreeNode("Backend Flags");
      if (bVar2) {
        HelpMarker(
                  "Those flags are set by the back-ends (imgui_impl_xxx files) to specify their capabilities."
                  );
        doc = (MyDocument *)CONCAT44(doc._4_4_,pIVar14->BackendFlags);
        CheckboxFlags("io.BackendFlags: HasGamepad",(uint *)&doc,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(uint *)&doc,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(uint *)&doc,4);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(uint *)&doc,8);
        TreePop();
        Separator();
      }
      bVar2 = TreeNode("Style");
      if (bVar2) {
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      bVar2 = TreeNode("Capture/Logging");
      if (bVar2) {
        TextWrapped(
                   "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded."
                   );
        HelpMarker(
                  "Try opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        TextWrapped(
                   "You can also call ImGui::LogText() to output directly to the log without a visual output."
                   );
        doc = (MyDocument *)0x0;
        bVar2 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)&doc);
        if (bVar2) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    bVar2 = CollapsingHeader("Window options",0);
    if (bVar2) {
      Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
      SameLine(150.0,-1.0);
      Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
      SameLine(300.0,-1.0);
      Checkbox("No menu",&ShowDemoWindow::no_menu);
      Checkbox("No move",&ShowDemoWindow::no_move);
      SameLine(150.0,-1.0);
      Checkbox("No resize",&ShowDemoWindow::no_resize);
      SameLine(300.0,-1.0);
      Checkbox("No collapse",&ShowDemoWindow::no_collapse);
      Checkbox("No close",&ShowDemoWindow::no_close);
      SameLine(150.0,-1.0);
      Checkbox("No nav",&ShowDemoWindow::no_nav);
      SameLine(300.0,-1.0);
      Checkbox("No background",&ShowDemoWindow::no_background);
      Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    bVar2 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar2) {
      bVar2 = TreeNode("Popups");
      if (bVar2) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        doc = (MyDocument *)0x0;
        bVar2 = Button("Select..",(ImVec2 *)&doc);
        if (bVar2) {
          OpenPopup("my_select_popup");
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar12 = "<None>";
        }
        else {
          pcVar12 = (&PTR_anon_var_dwarf_2ee2f_001d99f0)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar12,(char *)0x0);
        bVar2 = BeginPopup("my_select_popup",0);
        if (bVar2) {
          Text("Aquarium");
          Separator();
          ppuVar25 = &PTR_anon_var_dwarf_2ee2f_001d99f0;
          for (lVar24 = 0; lVar24 != 5; lVar24 = lVar24 + 1) {
            doc = (MyDocument *)0x0;
            bVar2 = Selectable(*ppuVar25,false,0,(ImVec2 *)&doc);
            if (bVar2) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar24;
            }
            ppuVar25 = ppuVar25 + 1;
          }
          EndPopup();
        }
        doc = (MyDocument *)0x0;
        bVar2 = Button("Toggle..",(ImVec2 *)&doc);
        if (bVar2) {
          OpenPopup("my_toggle_popup");
        }
        bVar2 = BeginPopup("my_toggle_popup",0);
        if (bVar2) {
          pbVar19 = (bool *)&ShowDemoWindowPopups()::toggles;
          for (lVar24 = 0; lVar24 != 0x28; lVar24 = lVar24 + 8) {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_2ee2f_001d99f0 + lVar24),"",pbVar19,true);
            pbVar19 = pbVar19 + 1;
          }
          bVar2 = BeginMenu("Sub-menu",true);
          if (bVar2) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar2 = IsItemHovered(0);
          if (bVar2) {
            SetTooltip("I am a tooltip over a popup");
          }
          doc = (MyDocument *)0x0;
          bVar2 = Button("Stacked Popup",(ImVec2 *)&doc);
          if (bVar2) {
            OpenPopup("another popup");
          }
          bVar2 = BeginPopup("another popup",0);
          if (bVar2) {
            pbVar19 = (bool *)&ShowDemoWindowPopups()::toggles;
            for (lVar24 = 0; lVar24 != 0x28; lVar24 = lVar24 + 8) {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_2ee2f_001d99f0 + lVar24),"",pbVar19,true
                      );
              pbVar19 = pbVar19 + 1;
            }
            bVar2 = BeginMenu("Sub-menu",true);
            if (bVar2) {
              MenuItem("Click me",(char *)0x0,false,true);
              doc = (MyDocument *)0x0;
              bVar2 = Button("Stacked Popup",(ImVec2 *)&doc);
              if (bVar2) {
                OpenPopup("another popup");
              }
              bVar2 = BeginPopup("another popup",0);
              if (bVar2) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        doc = (MyDocument *)0x0;
        bVar2 = Button("File Menu..",(ImVec2 *)&doc);
        if (bVar2) {
          OpenPopup("my_file_popup");
        }
        bVar2 = BeginPopup("my_file_popup",0);
        if (bVar2) {
          ShowExampleMenuFile();
          EndPopup();
        }
        TreePop();
      }
      bVar2 = TreeNode("Context menus");
      if (bVar2) {
        Text("Value = %.3f (<-- right-click here)",(double)ShowDemoWindowPopups()::value);
        bVar2 = BeginPopupContextItem("item context menu",1);
        if (bVar2) {
          doc = (MyDocument *)0x0;
          bVar2 = Selectable("Set to zero",false,0,(ImVec2 *)&doc);
          if (bVar2) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          doc = (MyDocument *)0x0;
          bVar2 = Selectable("Set to PI",false,0,(ImVec2 *)&doc);
          if (bVar2) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.0);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",1.0);
          EndPopup();
        }
        Text("(You can also right-click me to open the same popup as above.)");
        OpenPopupOnItemClick("item context menu",1);
        sprintf((char *)&doc,"Button: %s###Button",ShowDemoWindowPopups()::name);
        canvas_size.x = 0.0;
        canvas_size.y = 0.0;
        Button((char *)&doc,&canvas_size);
        bVar2 = BeginPopupContextItem((char *)0x0,1);
        if (bVar2) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,(ImGuiInputTextCallback)0x0,
                    (void *)0x0);
          canvas_size.x = 0.0;
          canvas_size.y = 0.0;
          bVar2 = Button("Close",&canvas_size);
          if (bVar2) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      bVar2 = TreeNode("Modals");
      if (bVar2) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside the window."
                   );
        doc = (MyDocument *)0x0;
        bVar2 = Button("Delete..",(ImVec2 *)&doc);
        if (bVar2) {
          OpenPopup("Delete?");
        }
        bVar2 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar2) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          doc = (MyDocument *)0x0;
          PushStyleVar(10,(ImVec2 *)&doc);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          doc = (MyDocument *)0x42f00000;
          bVar2 = Button("OK",(ImVec2 *)&doc);
          if (bVar2) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          doc = (MyDocument *)0x42f00000;
          bVar2 = Button("Cancel",(ImVec2 *)&doc);
          if (bVar2) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        doc = (MyDocument *)0x0;
        bVar2 = Button("Stacked modals..",(ImVec2 *)&doc);
        if (bVar2) {
          OpenPopup("Stacked 1");
        }
        bVar2 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar2) {
          bVar2 = BeginMenuBar();
          if (bVar2) {
            bVar2 = BeginMenu("File",true);
            if (bVar2) {
              MenuItem("Dummy menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          doc = (MyDocument *)0x0;
          bVar2 = Button("Add another modal..",(ImVec2 *)&doc);
          if (bVar2) {
            OpenPopup("Stacked 2");
          }
          canvas_size.x._0_1_ = 1;
          bVar2 = BeginPopupModal("Stacked 2",(bool *)&canvas_size,0);
          if (bVar2) {
            Text("Hello from Stacked The Second!");
            doc = (MyDocument *)0x0;
            bVar2 = Button("Close",(ImVec2 *)&doc);
            if (bVar2) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          doc = (MyDocument *)0x0;
          bVar2 = Button("Close",(ImVec2 *)&doc);
          if (bVar2) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      bVar2 = TreeNode("Menus inside a regular window");
      if (bVar2) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar2 = BeginMenu("Menu inside a regular window",true);
        if (bVar2) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    bVar2 = CollapsingHeader("Columns",0);
    if (bVar2) {
      PushID("Columns");
      Checkbox("Disable tree indentation",(bool *)&ShowDemoWindowColumns()::disable_indent);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Disable the indenting of tree nodes so demo columns can use the full window width."
                );
      if (ShowDemoWindowColumns()::disable_indent == '\x01') {
        PushStyleVar(0xf,0.0);
      }
      bVar2 = TreeNode("Basic");
      if (bVar2) {
        Text("Without border:");
        Columns(3,"mycolumns3",false);
        Separator();
        for (uVar5 = 0; uVar5 != 0xe; uVar5 = uVar5 + 1) {
          sprintf((char *)&doc,"Item %d",(ulong)uVar5);
          canvas_size.x = 0.0;
          canvas_size.y = 0.0;
          Selectable((char *)&doc,false,0,&canvas_size);
          NextColumn();
        }
        Columns(1,(char *)0x0,true);
        Separator();
        Text("With border:");
        Columns(4,"mycolumns",true);
        Separator();
        Text("ID");
        NextColumn();
        Text("Name");
        NextColumn();
        Text("Path");
        NextColumn();
        Text("Hovered");
        NextColumn();
        Separator();
        lVar24 = 0;
        for (uVar22 = 0; uVar22 != 3; uVar22 = uVar22 + 1) {
          sprintf((char *)&doc,"%04d",uVar22 & 0xffffffff);
          canvas_size.x = 0.0;
          canvas_size.y = 0.0;
          bVar2 = Selectable((char *)&doc,uVar22 == ShowDemoWindowColumns()::selected,2,&canvas_size
                            );
          if (bVar2) {
            ShowDemoWindowColumns()::selected = (uint)uVar22;
          }
          IsItemHovered(0);
          NextColumn();
          Text((char *)((long)&DAT_00189a4c + (long)*(int *)((long)&DAT_00189a4c + lVar24)));
          NextColumn();
          Text((char *)((long)&DAT_00189a58 + (long)*(int *)((long)&DAT_00189a58 + lVar24)));
          NextColumn();
          Text("%d");
          NextColumn();
          lVar24 = lVar24 + 4;
        }
        Columns(1,(char *)0x0,true);
        Separator();
        TreePop();
      }
      bVar2 = TreeNode("Borders");
      if (bVar2) {
        fVar26 = GetFontSize();
        SetNextItemWidth(fVar26 * 8.0);
        DragInt("##columns_count",&ShowDemoWindowColumns()::columns_count,0.1,2,10,"%d columns");
        if (ShowDemoWindowColumns()::columns_count < 2) {
          ShowDemoWindowColumns()::columns_count = 2;
        }
        SameLine(0.0,-1.0);
        Checkbox("horizontal",(bool *)&ShowDemoWindowColumns()::h_borders);
        SameLine(0.0,-1.0);
        Checkbox("vertical",(bool *)&ShowDemoWindowColumns()::v_borders);
        Columns(ShowDemoWindowColumns()::columns_count,(char *)0x0,
                (bool)ShowDemoWindowColumns()::v_borders);
        for (iVar18 = 0;
            SBORROW4(iVar18,ShowDemoWindowColumns()::columns_count * 3) !=
            iVar18 + ShowDemoWindowColumns()::columns_count * -3 < 0; iVar18 = iVar18 + 1) {
          if ((ShowDemoWindowColumns()::h_borders == '\x01') &&
             (iVar21 = GetColumnIndex(), iVar21 == 0)) {
            Separator();
          }
          Text("%c%c%c",(ulong)(iVar18 + 0x61U),(ulong)(iVar18 + 0x61U));
          fVar26 = GetColumnWidth(-1);
          Text("Width %.2f",(double)fVar26);
          IVar30 = GetContentRegionAvail();
          Text("Avail %.2f",(double)IVar30.x);
          fVar26 = GetColumnOffset(-1);
          Text("Offset %.2f",(double)fVar26);
          Text("Long text that is likely to clip");
          doc = (MyDocument *)0x80800000;
          Button("Button",(ImVec2 *)&doc);
          NextColumn();
        }
        Columns(1,(char *)0x0,true);
        if (ShowDemoWindowColumns()::h_borders != '\0') {
          Separator();
        }
        TreePop();
      }
      bVar2 = TreeNode("Mixed items");
      if (bVar2) {
        Columns(3,"mixed",true);
        Separator();
        Text("Hello");
        doc = (MyDocument *)0x0;
        Button("Banana",(ImVec2 *)&doc);
        NextColumn();
        Text("ImGui");
        doc = (MyDocument *)0x0;
        Button("Apple",(ImVec2 *)&doc);
        InputFloat("red",(float *)&ShowDemoWindowColumns()::foo,0.05,0.0,"%.3f",0);
        Text("An extra line here.");
        NextColumn();
        Text("Sailor");
        doc = (MyDocument *)0x0;
        Button("Corniflower",(ImVec2 *)&doc);
        InputFloat("blue",(float *)&ShowDemoWindowColumns()::bar,0.05,0.0,"%.3f",0);
        NextColumn();
        bVar2 = CollapsingHeader("Category A",0);
        if (bVar2) {
          Text("Blah blah blah");
        }
        NextColumn();
        bVar2 = CollapsingHeader("Category B",0);
        if (bVar2) {
          Text("Blah blah blah");
        }
        NextColumn();
        bVar2 = CollapsingHeader("Category C",0);
        if (bVar2) {
          Text("Blah blah blah");
        }
        NextColumn();
        Columns(1,(char *)0x0,true);
        Separator();
        TreePop();
      }
      bVar2 = TreeNode("Word-wrapping");
      if (bVar2) {
        Columns(2,"word-wrapping",true);
        Separator();
        TextWrapped("The quick brown fox jumps over the lazy dog.");
        TextWrapped("Hello Left");
        NextColumn();
        TextWrapped("The quick brown fox jumps over the lazy dog.");
        TextWrapped("Hello Right");
        Columns(1,(char *)0x0,true);
        Separator();
        TreePop();
      }
      bVar2 = TreeNode("Horizontal Scrolling");
      if (bVar2) {
        doc = (MyDocument *)0x44bb8000;
        SetNextWindowContentSize((ImVec2 *)&doc);
        fVar26 = GetFontSize();
        doc = (MyDocument *)((ulong)(uint)(fVar26 * 20.0) << 0x20);
        BeginChild("##ScrollingRegion",(ImVec2 *)&doc,false,0x800);
        Columns(10,(char *)0x0,true);
        ImGuiListClipper::Begin((ImGuiListClipper *)&doc,2000,-1.0);
        while (bVar2 = ImGuiListClipper::Step((ImGuiListClipper *)&doc), bVar2) {
          uVar5 = (uint)local_c8;
          while( true ) {
            if (local_c8._4_4_ <= (int)uVar5) break;
            for (uVar22 = 0; (int)uVar22 != 10; uVar22 = (ulong)((int)uVar22 + 1)) {
              Text("Line %d Column %d...",(ulong)uVar5,uVar22);
              NextColumn();
            }
            uVar5 = uVar5 + 1;
          }
        }
        Columns(1,(char *)0x0,true);
        EndChild();
        TreePop();
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)&doc);
      }
      bVar2 = TreeNode("Tree");
      if (bVar2) {
        Columns(2,"tree",true);
        for (ptr_id = (void *)0x0; ptr_id != (void *)0x3; ptr_id = (void *)((long)ptr_id + 1)) {
          bVar2 = TreeNode(ptr_id,"Node%d",(ulong)ptr_id & 0xffffffff);
          NextColumn();
          Text("Node contents");
          NextColumn();
          if (bVar2) {
            for (ptr_id_00 = (void *)0x0; ptr_id_00 != (void *)0x3;
                ptr_id_00 = (void *)((long)ptr_id_00 + 1)) {
              bVar2 = TreeNode(ptr_id_00,"Node%d.%d",(ulong)ptr_id & 0xffffffff);
              NextColumn();
              Text("Node contents");
              if (bVar2) {
                Text("Even more contents");
                bVar2 = TreeNode("Tree in column");
                if (bVar2) {
                  Text("The quick brown fox jumps over the lazy dog");
                  TreePop();
                }
                NextColumn();
                TreePop();
              }
              else {
                NextColumn();
              }
            }
            TreePop();
          }
        }
        Columns(1,(char *)0x0,true);
        TreePop();
      }
      if (ShowDemoWindowColumns()::disable_indent == '\x01') {
        PopStyleVar(1);
      }
      PopID();
    }
    bVar2 = CollapsingHeader("Filtering",0);
    if (bVar2) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar18 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar18 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      for (lVar24 = 0; lVar24 != 0x40; lVar24 = lVar24 + 8) {
        bVar2 = ImGuiTextFilter::PassFilter
                          ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                           *(char **)((long)&PTR_anon_var_dwarf_2f445_001d9a20 + lVar24),(char *)0x0
                          );
        if (bVar2) {
          BulletText("%s");
        }
      }
    }
    bVar2 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar2) {
      pIVar14 = GetIO();
      Text("WantCaptureMouse: %d",(ulong)pIVar14->WantCaptureMouse);
      Text("WantCaptureKeyboard: %d",(ulong)pIVar14->WantCaptureKeyboard);
      Text("WantTextInput: %d",(ulong)pIVar14->WantTextInput);
      Text("WantSetMousePos: %d",(ulong)pIVar14->WantSetMousePos);
      Text("NavActive: %d, NavVisible: %d",(ulong)pIVar14->NavActive,(ulong)pIVar14->NavVisible);
      bVar2 = TreeNode("Keyboard, Mouse & Navigation State");
      if (bVar2) {
        bVar2 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar2) {
          Text("Mouse pos: (%g, %g)",(double)(pIVar14->MousePos).x,(double)(pIVar14->MousePos).y);
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",(double)(pIVar14->MouseDelta).x);
        Text("Mouse down:");
        for (lVar24 = 0; lVar24 != 5; lVar24 = lVar24 + 1) {
          if (0.0 <= pIVar14->MouseDownDuration[lVar24]) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",(double)pIVar14->MouseDownDuration[lVar24]);
          }
        }
        Text("Mouse clicked:");
        for (iVar18 = 0; iVar18 != 5; iVar18 = iVar18 + 1) {
          bVar2 = IsMouseClicked(iVar18,false);
          if (bVar2) {
            SameLine(0.0,-1.0);
            Text("b%d");
          }
        }
        Text("Mouse dbl-clicked:");
        for (uVar5 = 0; uVar5 != 5; uVar5 = uVar5 + 1) {
          bVar2 = IsMouseDoubleClicked(uVar5);
          if (bVar2) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar5);
          }
        }
        Text("Mouse released:");
        for (uVar5 = 0; uVar5 != 5; uVar5 = uVar5 + 1) {
          bVar2 = IsMouseReleased(uVar5);
          if (bVar2) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar5);
          }
        }
        Text("Mouse wheel: %.1f",(double)pIVar14->MouseWheel);
        Text("Keys down:");
        for (uVar22 = 0; uVar22 != 0x200; uVar22 = uVar22 + 1) {
          if (0.0 <= pIVar14->KeysDownDuration[uVar22]) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X) (%.02f secs)",(double)pIVar14->KeysDownDuration[uVar22],
                 uVar22 & 0xffffffff,uVar22 & 0xffffffff);
          }
        }
        Text("Keys pressed:");
        for (uVar5 = 0; uVar5 != 0x200; uVar5 = uVar5 + 1) {
          bVar2 = IsKeyPressed(uVar5,true);
          if (bVar2) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar5,(ulong)uVar5);
          }
        }
        Text("Keys release:");
        for (uVar5 = 0; uVar5 != 0x200; uVar5 = uVar5 + 1) {
          bVar2 = IsKeyReleased(uVar5);
          if (bVar2) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar5,(ulong)uVar5);
          }
        }
        pcVar12 = "CTRL ";
        if (pIVar14->KeyCtrl == false) {
          pcVar12 = "";
        }
        pcVar13 = "SHIFT ";
        if (pIVar14->KeyShift == false) {
          pcVar13 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar12,pcVar13);
        Text("Chars queue:");
        for (iVar18 = 0; iVar18 < (pIVar14->InputQueueCharacters).Size; iVar18 = iVar18 + 1) {
          puVar17 = ImVector<unsigned_short>::operator[](&pIVar14->InputQueueCharacters,iVar18);
          uVar1 = *puVar17;
          SameLine(0.0,-1.0);
          uVar22 = (ulong)(uint)(int)(char)uVar1;
          if (0xde < (ushort)(uVar1 - 0x21)) {
            uVar22 = 0x3f;
          }
          Text("\'%c\' (0x%04X)",uVar22,(ulong)uVar1);
        }
        Text("NavInputs down:");
        for (uVar22 = 0; uVar22 != 0x15; uVar22 = uVar22 + 1) {
          if (0.0 < pIVar14->NavInputs[uVar22]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",(double)pIVar14->NavInputs[uVar22],uVar22 & 0xffffffff);
          }
        }
        Text("NavInputs pressed:");
        for (uVar22 = 0; uVar22 != 0x15; uVar22 = uVar22 + 1) {
          if ((pIVar14->NavInputsDownDuration[uVar22] == 0.0) &&
             (!NAN(pIVar14->NavInputsDownDuration[uVar22]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar22 & 0xffffffff);
          }
        }
        Text("NavInputs duration:");
        for (uVar22 = 0; uVar22 != 0x15; uVar22 = uVar22 + 1) {
          if (0.0 <= pIVar14->NavInputsDownDuration[uVar22]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",(double)pIVar14->NavInputsDownDuration[uVar22],uVar22 & 0xffffffff);
          }
        }
        doc = (MyDocument *)0x0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)&doc);
        bVar2 = IsItemHovered(0);
        if (bVar2) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)&doc);
        bVar2 = IsItemActive();
        if (bVar2) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      bVar2 = TreeNode("Tabbing");
      if (bVar2) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      bVar2 = TreeNode("Focus from code");
      if (bVar2) {
        doc = (MyDocument *)0x0;
        bVar2 = Button("Focus on 1",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar3 = Button("Focus on 2",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar4 = Button("Focus on 3",(ImVec2 *)&doc);
        if (bVar2) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar2 = IsItemActive();
        if (bVar3) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar3 = IsItemActive();
        uVar5 = (uint)bVar2;
        if (bVar3) {
          uVar5 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar4) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        bVar2 = IsItemActive();
        if (bVar2) {
          uVar5 = 3;
        }
        PopAllowKeyboardFocus();
        if (uVar5 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar5);
        }
        doc = (MyDocument *)0x0;
        bVar2 = Button("Focus on X",(ImVec2 *)&doc);
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar3 = Button("Focus on Y",(ImVec2 *)&doc);
        iVar18 = 1;
        if (!bVar3) {
          iVar18 = bVar2 - 1;
        }
        SameLine(0.0,-1.0);
        doc = (MyDocument *)0x0;
        bVar2 = Button("Focus on Z",(ImVec2 *)&doc);
        if (bVar2) {
          iVar18 = 2;
        }
        if (iVar18 != -1) {
          SetKeyboardFocusHere(iVar18);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",1.0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      bVar2 = TreeNode("Dragging");
      if (bVar2) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        for (uVar5 = 0; uVar5 != 3; uVar5 = uVar5 + 1) {
          bVar2 = IsMouseDragging(uVar5,-1.0);
          bVar3 = IsMouseDragging(uVar5,0.0);
          bVar4 = IsMouseDragging(uVar5,20.0);
          Text("IsMouseDragging(%d):\n  w/ default threshold: %d,\n  w/ zero threshold: %d\n  w/ large threshold: %d"
               ,(ulong)uVar5,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4);
        }
        doc = (MyDocument *)0x0;
        Button("Drag Me",(ImVec2 *)&doc);
        bVar2 = IsItemActive();
        if (bVar2) {
          pIVar15 = GetForegroundDrawList();
          IVar6 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar15,pIVar14->MouseClickedPos,&pIVar14->MousePos,IVar6,4.0);
        }
        GetMouseDragDelta(0,0.0);
        GetMouseDragDelta(0,-1.0);
        Text(
            "GetMouseDragDelta(0):\n  w/ default threshold: (%.1f, %.1f),\n  w/ zero threshold: (%.1f, %.1f)\nMouseDelta: (%.1f, %.1f)"
            );
        TreePop();
      }
      bVar2 = TreeNode("Mouse cursors");
      if (bVar2) {
        uVar5 = GetMouseCursor();
        IVar8 = GetMouseCursor();
        puVar23 = &DAT_001d9a60;
        Text("Current mouse cursor = %d: %s",(ulong)uVar5,(&DAT_001d9a60)[IVar8]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        for (uVar22 = 0; uVar22 != 8; uVar22 = uVar22 + 1) {
          sprintf((char *)&doc,"Mouse cursor %d: %s",uVar22 & 0xffffffff,*puVar23);
          Bullet();
          canvas_size.x = 0.0;
          canvas_size.y = 0.0;
          Selectable((char *)&doc,false,0,&canvas_size);
          bVar2 = IsItemHovered(0);
          if ((bVar2) || (bVar2 = IsItemFocused(), bVar2)) {
            SetMouseCursor((ImGuiMouseCursor)uVar22);
          }
          puVar23 = puVar23 + 1;
        }
        TreePop();
      }
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!"); // Exceptionally add an extra assert here for people confused with initial dear imgui setup

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_documents = false;
    static bool show_app_main_menu_bar = false;
    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);
    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)             { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_style_editor)        { ImGui::Begin("Style Editor", &show_app_style_editor); ImGui::ShowStyleEditor(); ImGui::End(); }
    if (show_app_about)               { ImGui::ShowAboutWindow(&show_app_about); }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file. Typically this isn't required! We only do it to make the Demo applications a little more welcoming.
    ImGui::SetNextWindowPos(ImVec2(650, 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default.
    //ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.65f);    // Use 2/3 of the space for widgets and 1/3 for labels (default)
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);           // Use fixed width for labels (by passing a negative value), the rest goes to widgets. We choose a width proportional to our font size.

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Tools"))
        {
            ImGui::MenuItem("Metrics", NULL, &show_app_metrics);
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("Please see the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("Please see the comments in imgui.cpp.");
        ImGui::BulletText("Please see the examples/ application.");
        ImGui::BulletText("Enable 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Enable 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Required back-end to feed in gamepad inputs in io.NavInputs[] and set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse) // Create a way to restore this flag otherwise we could be stuck completely!
            {
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_Space)))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct back-end to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Set to false to disable blinking cursor, for users who consider it distracting");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor for you. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker("Those flags are set by the back-ends (imgui_impl_xxx files) to specify their capabilities.");
            ImGuiBackendFlags backend_flags = io.BackendFlags; // Make a local copy to avoid modifying actual back-end flags.
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", (unsigned int *)&backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Style"))
        {
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Capture/Logging"))
        {
            ImGui::TextWrapped("The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.");
            HelpMarker("Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();
            ImGui::TextWrapped("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    if (ImGui::CollapsingHeader("Window options"))
    {
        ImGui::Checkbox("No titlebar", &no_titlebar); ImGui::SameLine(150);
        ImGui::Checkbox("No scrollbar", &no_scrollbar); ImGui::SameLine(300);
        ImGui::Checkbox("No menu", &no_menu);
        ImGui::Checkbox("No move", &no_move); ImGui::SameLine(150);
        ImGui::Checkbox("No resize", &no_resize); ImGui::SameLine(300);
        ImGui::Checkbox("No collapse", &no_collapse);
        ImGui::Checkbox("No close", &no_close); ImGui::SameLine(150);
        ImGui::Checkbox("No nav", &no_nav); ImGui::SameLine(300);
        ImGui::Checkbox("No background", &no_background);
        ImGui::Checkbox("No bring to front", &no_bring_to_front);
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowColumns();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::End();
}